

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O0

BOOL HeapFree(HANDLE hHeap,DWORD dwFlags,LPVOID lpMem)

{
  BOOL local_24;
  BOOL bRetVal;
  LPVOID lpMem_local;
  DWORD dwFlags_local;
  HANDLE hHeap_local;
  
  local_24 = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (hHeap == (HANDLE)0x1020304) {
    if (dwFlags == 0) {
      if (lpMem == (LPVOID)0x0) {
        local_24 = 1;
      }
      else {
        local_24 = 1;
        PAL_free(lpMem);
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","HeapFree",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/memory/heap.cpp"
              ,0x138);
      fprintf(_stderr,"Invalid parameter dwFlags=%#x\n",(ulong)dwFlags);
      SetLastError(0x57);
    }
  }
  else {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return local_24;
}

Assistant:

BOOL
PALAPI
HeapFree(
    IN HANDLE hHeap,
    IN DWORD dwFlags,
    IN LPVOID lpMem)
{
    BOOL bRetVal = FALSE;

    PERF_ENTRY(HeapFree);
    ENTRY("HeapFree (hHeap=%p, dwFlags = %#x, lpMem=%p)\n",
          hHeap, dwFlags, lpMem);

#ifdef __APPLE__
    if (hHeap == NULL)
#else // __APPLE__
    if (hHeap != (HANDLE) DUMMY_HEAP)
#endif // __APPLE__ else
    {
        ERROR("Invalid heap handle\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    if (dwFlags != 0)
    {
        ASSERT("Invalid parameter dwFlags=%#x\n", dwFlags);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    if (!lpMem)
    {
        bRetVal = TRUE;
        goto done;
    }

    bRetVal = TRUE;
#ifdef __APPLE__
    // This is patterned off of InternalFree in malloc.cpp.
    {
        malloc_zone_free((malloc_zone_t *)hHeap, lpMem);
    }
#else // __APPLE__
    PAL_free (lpMem);
#endif // __APPLE__ else

done:
    LOGEXIT( "HeapFree returning BOOL %d\n", bRetVal );
    PERF_EXIT(HeapFree);
    return bRetVal;
}